

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O2

uint __thiscall ON_FixedSizePool::MaximumElementId(ON_FixedSizePool *this,size_t id_offset)

{
  uint uVar1;
  char *sFormat;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void **ppvVar4;
  uint uVar5;
  int line_number;
  
  if (id_offset < 8) {
    sFormat = "id_offset is too small.";
    line_number = 0x3d3;
  }
  else {
    if (id_offset + 4 <= this->m_sizeof_element) {
      puVar2 = (undefined8 *)this->m_first_block;
      uVar5 = 0;
      while (puVar2 != (undefined8 *)0x0) {
        if (puVar2 == (undefined8 *)this->m_al_block) {
          puVar3 = (undefined8 *)0x0;
          ppvVar4 = &this->m_al_element_array;
        }
        else {
          puVar3 = (undefined8 *)*puVar2;
          ppvVar4 = (void **)(puVar2 + 1);
        }
        uVar1 = *(uint *)((long)*ppvVar4 + (id_offset - this->m_sizeof_element));
        puVar2 = puVar3;
        if (uVar5 < uVar1) {
          uVar5 = uVar1;
        }
      }
      return uVar5;
    }
    sFormat = "id_offset is too large.";
    line_number = 0x3d9;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
             ,line_number,"",sFormat);
  return 0;
}

Assistant:

unsigned int ON_FixedSizePool::MaximumElementId(
  size_t id_offset
) const
{
  const char* block;
  const char* block_end;
  const char* next_block;
  unsigned int maximum_id = 0;
  if (id_offset < sizeof(void*))
  {
    // caller is confused.
    ON_ERROR("id_offset is too small.");
    return 0;
  }
  if (id_offset + sizeof(maximum_id) > m_sizeof_element)
  {
    // caller is confused.
    ON_ERROR("id_offset is too large.");
    return 0;
  }

  for (block = (const char*)m_first_block; 0 != block; block = next_block)
  {
    if (block == m_al_block)
    {
      next_block = nullptr;
      block_end = (const char*)m_al_element_array;
      block += (2 * sizeof(void*));
    }
    else
    {
      next_block = *((const char**)block);
      block += sizeof(void*);
      block_end = *((const char**)(block));
      block += sizeof(void*);
    }

    unsigned int i1 = *((const unsigned int*)(block_end-(m_sizeof_element-id_offset)));
    if (i1 > maximum_id)
      maximum_id = i1;
  }

  return maximum_id;
}